

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

ProfiledInstr * __thiscall IR::ProfiledInstr::CopyProfiledInstr(ProfiledInstr *this)

{
  JitArenaAllocator *pJVar1;
  ProfiledInstr *this_00;
  TrackAllocData local_40;
  ProfiledInstr *local_18;
  ProfiledInstr *profiledInstr;
  ProfiledInstr *this_local;
  
  pJVar1 = ((this->super_Instr).m_func)->m_alloc;
  profiledInstr = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x379);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_40);
  this_00 = (ProfiledInstr *)new<Memory::JitArenaAllocator>(0x60,pJVar1,0x4e98c0);
  ProfiledInstr(this_00,false);
  local_18 = this_00;
  Instr::Init((Instr *)this_00,(this->super_Instr).m_opcode,InstrKindProfiled,
              (this->super_Instr).m_func);
  local_18->u = this->u;
  return local_18;
}

Assistant:

ProfiledInstr *
ProfiledInstr::CopyProfiledInstr() const
{
    IR::ProfiledInstr * profiledInstr;

    profiledInstr = JitAnew(this->m_func->m_alloc, IR::ProfiledInstr);
    profiledInstr->Init(this->m_opcode, InstrKindProfiled, this->m_func);
    profiledInstr->u = this->u;

    return profiledInstr;
}